

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

void nuts_tran_pipe_id(char *scheme)

{
  _Bool _Var1;
  nng_err nVar2;
  int iVar3;
  nng_pipe p;
  nng_pipe p_00;
  int iVar4;
  char *pcVar5;
  void *pvVar6;
  nng_url *local_48;
  nng_url *url;
  nng_dialer d1;
  nng_listener l1;
  nng_msg *msg;
  nng_socket s1;
  nng_socket s2;
  
  msg._0_4_ = 0;
  msg._4_4_ = 0;
  url._4_4_ = 0;
  url._0_4_ = 0;
  pcVar5 = strchr(scheme,0x36);
  if (pcVar5 != (char *)0x0) {
    _Var1 = nuts_has_ipv6();
    if (!_Var1) {
      acutest_skip_("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                    ,0x1a0,"No IPv6 support present");
      return;
    }
  }
  nuts_scratch_addr_zero(scheme,0x40,nuts_tran_pipe_id::nuts_addr_);
  nVar2 = nng_pair1_open((nng_socket *)&msg);
  pcVar5 = nng_strerror(nVar2);
  iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                         ,0x1a2,"%s: expected success, got %s (%d)","nng_pair1_open(&(s1))",pcVar5,
                         nVar2);
  if (iVar3 != 0) {
    nVar2 = nng_pair1_open((nng_socket *)((long)&msg + 4));
    pcVar5 = nng_strerror(nVar2);
    iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                           ,0x1a3,"%s: expected success, got %s (%d)","nng_pair1_open(&(s2))",pcVar5
                           ,nVar2);
    if (iVar3 != 0) {
      nVar2 = nng_socket_set_ms(msg._0_4_,"send-timeout",100);
      pcVar5 = nng_strerror(nVar2);
      iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                             ,0x1a4,"%s: expected success, got %s (%d)",
                             "nng_socket_set_ms(s1, NNG_OPT_SENDTIMEO, 100)",pcVar5,nVar2);
      if (iVar3 != 0) {
        nVar2 = nng_socket_set_ms(msg._4_4_,"send-timeout",100);
        pcVar5 = nng_strerror(nVar2);
        iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                               ,0x1a5,"%s: expected success, got %s (%d)",
                               "nng_socket_set_ms(s2, NNG_OPT_SENDTIMEO, 100)",pcVar5,nVar2);
        if (iVar3 != 0) {
          nVar2 = nng_socket_set_ms(msg._0_4_,"recv-timeout",100);
          pcVar5 = nng_strerror(nVar2);
          iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                 ,0x1a6,"%s: expected success, got %s (%d)",
                                 "nng_socket_set_ms(s1, NNG_OPT_RECVTIMEO, 100)",pcVar5,nVar2);
          if (iVar3 != 0) {
            nVar2 = nng_socket_set_ms(msg._4_4_,"recv-timeout",100);
            pcVar5 = nng_strerror(nVar2);
            iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                   ,0x1a7,"%s: expected success, got %s (%d)",
                                   "nng_socket_set_ms(s2, NNG_OPT_RECVTIMEO, 100)",pcVar5,nVar2);
            if (iVar3 != 0) {
              nVar2 = nng_listen(msg._0_4_,nuts_tran_pipe_id::nuts_addr_,
                                 (nng_listener *)((long)&url + 4),0);
              pcVar5 = nng_strerror(nVar2);
              iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                     ,0x1a8,"%s: expected success, got %s (%d)",
                                     "nng_listen(s1, addr, &l1, 0)",pcVar5,nVar2);
              if (iVar3 != 0) {
                nVar2 = nng_listener_get_url(url._4_4_,&local_48);
                pcVar5 = nng_strerror(nVar2);
                iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                       ,0x1a9,"%s: expected success, got %s (%d)",
                                       "nng_listener_get_url(l1, &url)",pcVar5,nVar2);
                if (iVar3 != 0) {
                  nVar2 = nng_dial_url(msg._4_4_,local_48,(nng_dialer *)&url,0);
                  pcVar5 = nng_strerror(nVar2);
                  iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                         ,0x1aa,"%s: expected success, got %s (%d)",
                                         "nng_dial_url(s2, url, &d1, 0)",pcVar5,nVar2);
                  if (iVar3 != 0) {
                    iVar3 = nng_listener_id(url._4_4_);
                    acutest_check_((uint)(0 < iVar3),
                                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                   ,0x1ab,"%s","nng_listener_id(l1) > 0");
                    iVar3 = nng_dialer_id(url._0_4_);
                    acutest_check_((uint)(0 < iVar3),
                                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                   ,0x1ac,"%s","nng_dialer_id(d1) > 0");
                    nVar2 = nng_send(msg._0_4_,"ping",5,0);
                    pcVar5 = nng_strerror(nVar2);
                    iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                           ,0x1ad,"%s: expected success, got %s (%d)",
                                           "nng_send(s1, \"ping\", strlen(\"ping\") + 1, 0)",pcVar5,
                                           nVar2);
                    if (iVar3 != 0) {
                      nVar2 = nng_recvmsg(msg._4_4_,(nng_msg **)&d1,0);
                      pcVar5 = nng_strerror(nVar2);
                      iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                             ,0x1ae,"%s: expected success, got %s (%d)",
                                             "nng_recvmsg(s2, &msg, 0)",pcVar5,nVar2);
                      if (iVar3 != 0) {
                        pcVar5 = (char *)nng_msg_body(_d1);
                        iVar3 = strcmp(pcVar5,"ping");
                        pvVar6 = nng_msg_body(_d1);
                        acutest_check_((uint)(iVar3 == 0),
                                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                       ,0x1af,"%s == %s",pvVar6,"ping",nVar2);
                        p = nng_msg_get_pipe(_d1);
                        nng_msg_free(_d1);
                        iVar3 = nng_pipe_id(p);
                        acutest_check_((uint)(0 < iVar3),
                                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                       ,0x1b2,"%s","nng_pipe_id(p1) > 0");
                        nVar2 = nng_send(msg._4_4_,"acknowledge",0xc,0);
                        pcVar5 = nng_strerror(nVar2);
                        iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                               ,0x1b3,"%s: expected success, got %s (%d)",
                                               "nng_send(s2, \"acknowledge\", strlen(\"acknowledge\") + 1, 0)"
                                               ,pcVar5,nVar2);
                        if (iVar3 != 0) {
                          nVar2 = nng_recvmsg(msg._0_4_,(nng_msg **)&d1,0);
                          pcVar5 = nng_strerror(nVar2);
                          iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                                 ,0x1b4,"%s: expected success, got %s (%d)",
                                                 "nng_recvmsg(s1, &msg, 0)",pcVar5,nVar2);
                          if (iVar3 != 0) {
                            pcVar5 = (char *)nng_msg_body(_d1);
                            iVar3 = strcmp(pcVar5,"acknowledge");
                            pvVar6 = nng_msg_body(_d1);
                            acutest_check_((uint)(iVar3 == 0),
                                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                           ,0x1b5,"%s == %s",pvVar6,"acknowledge",nVar2);
                            p_00 = nng_msg_get_pipe(_d1);
                            iVar3 = nng_pipe_id(p_00);
                            acutest_check_((uint)(0 < iVar3),
                                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                           ,0x1b7,"%s","nng_pipe_id(p2) > 0");
                            nng_msg_free(_d1);
                            iVar3 = nng_pipe_id(p);
                            iVar4 = nng_pipe_id(p_00);
                            acutest_check_((uint)(iVar3 != iVar4),
                                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                           ,0x1b9,"%s","nng_pipe_id(p1) != nng_pipe_id(p2)");
                            nVar2 = nng_socket_close(msg._0_4_);
                            pcVar5 = nng_strerror(nVar2);
                            iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                                  ,0x1ba,"%s: expected success, got %s (%d)",
                                                  "nng_socket_close(s1)",pcVar5,nVar2);
                            if (iVar3 != 0) {
                              nVar2 = nng_socket_close(msg._4_4_);
                              pcVar5 = nng_strerror(nVar2);
                              iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                                  ,0x1bb,"%s: expected success, got %s (%d)",
                                                  "nng_socket_close(s2)",pcVar5,nVar2);
                              if (iVar3 != 0) {
                                return;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  acutest_abort_();
}

Assistant:

void
nuts_tran_pipe_id(const char *scheme)
{
	nng_socket     s1 = NNG_SOCKET_INITIALIZER;
	nng_socket     s2 = NNG_SOCKET_INITIALIZER;
	nng_listener   l1 = NNG_LISTENER_INITIALIZER;
	nng_dialer     d1 = NNG_LISTENER_INITIALIZER;
	const char    *addr;
	nng_msg       *msg;
	nng_pipe       p1;
	nng_pipe       p2;
	const nng_url *url;

	NUTS_SKIP_IF_IPV6_NEEDED_AND_ABSENT(scheme);
	NUTS_ADDR_ZERO(addr, scheme);
	NUTS_OPEN(s1);
	NUTS_OPEN(s2);
	NUTS_PASS(nng_socket_set_ms(s1, NNG_OPT_SENDTIMEO, 100));
	NUTS_PASS(nng_socket_set_ms(s2, NNG_OPT_SENDTIMEO, 100));
	NUTS_PASS(nng_socket_set_ms(s1, NNG_OPT_RECVTIMEO, 100));
	NUTS_PASS(nng_socket_set_ms(s2, NNG_OPT_RECVTIMEO, 100));
	NUTS_PASS(nng_listen(s1, addr, &l1, 0));
	NUTS_PASS(nng_listener_get_url(l1, &url));
	NUTS_PASS(nng_dial_url(s2, url, &d1, 0));
	NUTS_TRUE(nng_listener_id(l1) > 0);
	NUTS_TRUE(nng_dialer_id(d1) > 0);
	NUTS_SEND(s1, "ping");
	NUTS_PASS(nng_recvmsg(s2, &msg, 0));
	NUTS_MATCH(nng_msg_body(msg), "ping");
	p1 = nng_msg_get_pipe(msg);
	nng_msg_free(msg);
	NUTS_TRUE(nng_pipe_id(p1) > 0);
	NUTS_SEND(s2, "acknowledge");
	NUTS_PASS(nng_recvmsg(s1, &msg, 0));
	NUTS_MATCH(nng_msg_body(msg), "acknowledge");
	p2 = nng_msg_get_pipe(msg);
	NUTS_TRUE(nng_pipe_id(p2) > 0);
	nng_msg_free(msg);
	NUTS_TRUE(nng_pipe_id(p1) != nng_pipe_id(p2));
	NUTS_CLOSE(s1);
	NUTS_CLOSE(s2);
}